

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O2

void __thiscall btDbvt::collideTV(btDbvt *this,btDbvtNode *root,btDbvtVolume *vol,ICollide *policy)

{
  btDbvtNode *a;
  bool bVar1;
  btAlignedObjectArray<const_btDbvtNode_*> stack;
  btDbvtNode *root_local;
  btDbvtNode *local_50;
  btDbvtVolume volume;
  
  if (root != (btDbvtNode *)0x0) {
    volume.mi.m_floats._0_8_ = *(undefined8 *)(vol->mi).m_floats;
    volume.mi.m_floats._8_8_ = *(undefined8 *)((vol->mi).m_floats + 2);
    volume.mx.m_floats._0_8_ = *(undefined8 *)(vol->mx).m_floats;
    volume.mx.m_floats._8_8_ = *(undefined8 *)((vol->mx).m_floats + 2);
    stack.m_ownsMemory = true;
    stack.m_data = (btDbvtNode **)0x0;
    stack.m_size = 0;
    stack.m_capacity = 0;
    local_50 = (btDbvtNode *)0x0;
    root_local = root;
    btAlignedObjectArray<const_btDbvtNode_*>::resize(&stack,0,&local_50);
    btAlignedObjectArray<const_btDbvtNode_*>::reserve(&stack,0x40);
    btAlignedObjectArray<const_btDbvtNode_*>::push_back(&stack,&root_local);
    do {
      a = stack.m_data[(long)stack.m_size + -1];
      stack.m_size = stack.m_size + -1;
      bVar1 = Intersect(&a->volume,&volume);
      if (bVar1) {
        if (*(long *)((long)&a->field_2 + 8) == 0) {
          (*policy->_vptr_ICollide[3])(policy,a);
        }
        else {
          btAlignedObjectArray<const_btDbvtNode_*>::push_back(&stack,(a->field_2).childs);
          btAlignedObjectArray<const_btDbvtNode_*>::push_back(&stack,(a->field_2).childs + 1);
        }
      }
    } while (0 < stack.m_size);
    btAlignedObjectArray<const_btDbvtNode_*>::~btAlignedObjectArray(&stack);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTV(	const btDbvtNode* root,
								  const btDbvtVolume& vol,
								  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
		if(root)
		{
			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume(vol);
			btAlignedObjectArray<const btDbvtNode*>	stack;
			stack.resize(0);
			stack.reserve(SIMPLE_STACKSIZE);
			stack.push_back(root);
			do	{
				const btDbvtNode*	n=stack[stack.size()-1];
				stack.pop_back();
				if(Intersect(n->volume,volume))
				{
					if(n->isinternal())
					{
						stack.push_back(n->childs[0]);
						stack.push_back(n->childs[1]);
					}
					else
					{
						policy.Process(n);
					}
				}
			} while(stack.size()>0);
		}
}